

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

PNode * add_PNode(Parser *p,int symbol,d_loc_t *start_loc,char *e,PNode *pn,D_Reduction *r,
                 VecZNode *path,D_Shift *sh)

{
  VecPNode *v;
  uint32 *puVar1;
  AssocKind cassoc;
  D_ReductionCode p_Var2;
  PNode *pPVar3;
  PNode **ppPVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  PNode *pn_00;
  PNode *pPVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  PNode *_t_1;
  PNode *pPVar15;
  PNode *pPVar16;
  PNode **ppPVar17;
  uint *hash_00;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  PNode *_t;
  uint hash;
  D_Scope *local_98;
  VecPNode local_90;
  VecPNode vx;
  
  local_98 = equiv_D_Scope((pn->parse_node).scope);
  hash_00 = &hash;
  pn_00 = find_PNode(p,start_loc->s,e,symbol,local_98,hash_00);
  if (pn_00 != (PNode *)0x0) {
    iVar9 = PNode_equal(p,pn_00,r,path,sh);
    pPVar10 = pn_00;
    while( true ) {
      if (iVar9 != 0) {
        return pn_00;
      }
      pPVar10 = pPVar10->ambiguities;
      if (pPVar10 == (PNode *)0x0) break;
      iVar9 = PNode_equal(p,pPVar10,r,path,sh);
    }
  }
  pPVar10 = p->free_pnodes;
  uVar12 = (ulong)((p->user).sizeof_user_parse_node + 0xd0);
  if (pPVar10 == (PNode *)0x0) {
    pPVar10 = (PNode *)malloc(uVar12);
  }
  else {
    p->free_pnodes = pPVar10->all_next;
  }
  p->pnodes = p->pnodes + 1;
  memset(pPVar10,0,uVar12);
  pPVar10->hash = hash;
  (pPVar10->parse_node).symbol = symbol;
  pcVar11 = start_loc->pathname;
  uVar5 = *(undefined4 *)&start_loc->ws;
  uVar6 = *(undefined4 *)((long)&start_loc->ws + 4);
  iVar9 = start_loc->col;
  iVar7 = start_loc->line;
  (pPVar10->parse_node).start_loc.s = start_loc->s;
  (pPVar10->parse_node).start_loc.pathname = pcVar11;
  *(undefined4 *)&(pPVar10->parse_node).start_loc.ws = uVar5;
  *(undefined4 *)((long)&(pPVar10->parse_node).start_loc.ws + 4) = uVar6;
  (pPVar10->parse_node).start_loc.col = iVar9;
  (pPVar10->parse_node).start_loc.line = iVar7;
  pPVar10->ws_before = start_loc->ws;
  pcVar11 = e;
  if (path != (VecZNode *)0x0 && r != (D_Reduction *)0x0) {
    pcVar11 = (pn->parse_node).end;
  }
  (pPVar10->parse_node).end = pcVar11;
  (pPVar10->parse_node).end_skip = e;
  pPVar10->shift = sh;
  pPVar10->reduction = r;
  (pPVar10->parse_node).scope = (pn->parse_node).scope;
  pPVar10->initial_scope = local_98;
  pPVar10->latest = pPVar10;
  pPVar10->ws_after = e;
  if (sh == (D_Shift *)0x0) {
    if (r != (D_Reduction *)0x0) {
      if (path != (VecZNode *)0x0) {
        uVar18 = path->n;
        v = &pPVar10->children;
        ppPVar17 = (pPVar10->children).e;
        while (uVar18 = uVar18 - 1, -1 < (int)uVar18) {
          pPVar16 = path->v[uVar18 & 0x7fffffff]->pn;
          pPVar15 = pPVar16->latest;
          while (pPVar3 = pPVar15->latest, pPVar15 != pPVar3) {
            pPVar3->refcount = pPVar3->refcount + 1;
            puVar1 = &pPVar15->refcount;
            *puVar1 = *puVar1 - 1;
            if (*puVar1 == 0) {
              free_PNode(p,pPVar15);
            }
            pPVar16->latest = pPVar3;
            pPVar15 = pPVar3;
          }
          pPVar15->refcount = pPVar15->refcount + 1;
          ppPVar4 = (pPVar10->children).v;
          if (ppPVar4 == (PNode **)0x0) {
            (pPVar10->children).v = ppPVar17;
            uVar20 = (pPVar10->children).n;
            (pPVar10->children).n = uVar20 + 1;
            (pPVar10->children).e[uVar20] = pPVar15;
          }
          else {
            uVar20 = v->n;
            if (ppPVar4 == ppPVar17) {
              if (2 < uVar20) goto LAB_0014504c;
LAB_0014500e:
              v->n = uVar20 + 1;
              ppPVar4[uVar20] = pPVar15;
            }
            else {
              if ((uVar20 & 7) != 0) goto LAB_0014500e;
LAB_0014504c:
              vec_add_internal(v,pPVar15);
            }
          }
        }
      }
      uVar18 = (pPVar10->children).n;
      uVar20 = 0;
      for (uVar12 = 0; uVar18 != uVar12; uVar12 = uVar12 + 1) {
        pPVar16 = (pPVar10->children).v[uVar12];
        if (pPVar16->op_assoc != ASSOC_NONE) {
          pPVar10->assoc = pPVar16->op_assoc;
          pPVar10->priority = pPVar16->op_priority;
        }
        if (uVar20 <= pPVar16->height) {
          uVar20 = pPVar16->height + 1;
        }
      }
      pPVar10->op_assoc = (uint)r->op_assoc;
      pPVar10->op_priority = r->op_priority;
      pPVar10->height = uVar20;
      if (r->rule_assoc != 0) {
        pPVar10->assoc = (uint)r->rule_assoc;
        pPVar10->priority = r->rule_priority;
      }
      if ((r->speculative_code != (D_ReductionCode)0x0) &&
         (iVar9 = (*r->speculative_code)(pPVar10,(pPVar10->children).v,uVar18,0x90,&p->user),
         iVar9 != 0)) goto LAB_001450ea;
      if ((path != (VecZNode *)0x0) && (uVar18 = path->n, 1 < uVar18)) {
        ppPVar17 = (pPVar10->children).v;
        for (uVar20 = 0; uVar20 < uVar18; uVar20 = uVar20 + (uVar18 - 1)) {
          pPVar16 = ppPVar17[uVar20];
          cassoc = pPVar16->assoc;
          if (((cassoc != ASSOC_NONE) && (pPVar10->assoc != ASSOC_NONE)) &&
             (iVar9 = check_child(pPVar10->priority,pPVar10->assoc,pPVar16->priority,cassoc,
                                  (uint)(uVar18 - 1 == uVar20),(int)hash_00), iVar9 == 0)) {
            free_PNode(p,pPVar10);
            pPVar10 = (PNode *)0x0;
            break;
          }
        }
      }
    }
  }
  else {
    pPVar10->op_assoc = (uint)sh->op_assoc;
    pPVar10->op_priority = sh->op_priority;
    p_Var2 = sh->speculative_code;
    if ((p_Var2 != (D_ReductionCode)0x0) && (sh->action_index != 0xffffffff)) {
      vx.e[0] = (PNode *)0x0;
      vx.e[1] = (PNode *)0x0;
      vx.n = 0;
      vx.i = 0;
      vx.v = (PNode **)0x0;
      vx.e[2] = (PNode *)((ulong)(uint)sh->action_index << 0x20);
      pPVar10->reduction = (D_Reduction *)&vx;
      iVar9 = (*p_Var2)(pPVar10,(pPVar10->children).v,(pPVar10->children).n,0x90,&p->user);
      if (iVar9 == 0) {
        pPVar10->reduction = (D_Reduction *)0x0;
      }
      else {
LAB_001450ea:
        free_PNode(p,pPVar10);
        pPVar10 = (PNode *)0x0;
      }
    }
  }
  if (pn_00 == (PNode *)0x0) {
    if (pPVar10 != (PNode *)0x0) {
      insert_PNode(p,pPVar10);
      return pPVar10;
    }
    return (PNode *)0x0;
  }
  if (pPVar10 == (PNode *)0x0) {
    return pn_00;
  }
  p->compares = p->compares + 1;
  if ((((p->user).dont_use_deep_priorities_for_disambiguation == 0) &&
      (pPVar10->assoc != ASSOC_NONE)) && (pn_00->assoc != ASSOC_NONE)) {
    vx._0_8_ = vx._0_8_ & 0xffffffff00000000;
    vx.v = (PNode **)0x0;
    local_90.n = 0;
    local_90.v = (PNode **)0x0;
    get_unshared_pnodes(p,pPVar10,pn_00,&vx,&local_90);
    if (vx.v != (PNode **)0x0) {
      qsort(vx.v,vx._0_8_ & 0xffffffff,8,prioritycmp);
    }
    if (local_90.v == (PNode **)0x0) {
      ppPVar17 = (PNode **)0x0;
    }
    else {
      qsort(local_90.v,(ulong)local_90.n,8,prioritycmp);
      ppPVar17 = local_90.v;
    }
    uVar13 = vx._0_8_ & 0xffffffff;
    uVar14 = (ulong)local_90.n;
    uVar12 = uVar13;
    if (uVar14 < uVar13) {
      uVar12 = uVar14;
    }
    iVar9 = 0;
    uVar8 = 0;
    do {
      uVar19 = uVar8;
      if (uVar12 == uVar19) goto LAB_001452e2;
      if (ppPVar17[uVar19]->priority < vx.v[uVar19]->priority) {
        iVar9 = -1;
        uVar12 = uVar19;
        goto LAB_001452e2;
      }
      uVar8 = uVar19 + 1;
    } while (ppPVar17[uVar19]->priority <= vx.v[uVar19]->priority);
    iVar9 = 1;
    uVar12 = uVar19;
LAB_001452e2:
    if (vx.v != vx.e && vx.v != (PNode **)0x0) {
      free(vx.v);
      ppPVar17 = local_90.v;
    }
    vx._0_8_ = vx._0_8_ & 0xffffffff00000000;
    vx.v = (PNode **)0x0;
    if (ppPVar17 != local_90.e && ppPVar17 != (PNode **)0x0) {
      free(ppPVar17);
    }
    if (uVar12 == uVar13 || uVar14 <= uVar12) goto LAB_00145114;
  }
  else {
LAB_00145114:
    if (((p->user).dont_use_greediness_for_disambiguation != 0) ||
       (iVar9 = cmp_greediness(p,pPVar10,pn_00), iVar9 == 0)) {
      if ((p->user).dont_use_height_for_disambiguation == 0) {
        if (pPVar10->height < pn_00->height) goto LAB_00145369;
        if (pPVar10->height <= pn_00->height) goto LAB_0014512a;
        goto LAB_0014535c;
      }
      goto LAB_0014512a;
    }
  }
  if (iVar9 == -1) {
LAB_00145369:
    insert_PNode(p,pPVar10);
    pPVar16 = pn_00->latest;
    while (pPVar15 = pPVar16->latest, pPVar16 != pPVar15) {
      pPVar15->refcount = pPVar15->refcount + 1;
      puVar1 = &pPVar16->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pPVar16);
      }
      pn_00->latest = pPVar15;
      pPVar16 = pPVar15;
    }
    pPVar10->refcount = pPVar10->refcount + 1;
    pPVar16->latest = pPVar10;
    return pPVar10;
  }
  if (iVar9 == 1) {
LAB_0014535c:
    free_PNode(p,pPVar10);
    return pn_00;
  }
LAB_0014512a:
  pPVar10->refcount = pPVar10->refcount + 1;
  pPVar10->ambiguities = pn_00->ambiguities;
  pn_00->ambiguities = pPVar10;
  return pn_00;
}

Assistant:

static PNode *add_PNode(Parser *p, int symbol, d_loc_t *start_loc, char *e, PNode *pn, D_Reduction *r, VecZNode *path,
                        D_Shift *sh) {
  D_Scope *scope = equiv_D_Scope(pn->parse_node.scope);
  uint hash;
  PNode *old_pn = find_PNode(p, start_loc->s, e, symbol, scope, &hash), *new_pn;
  if (old_pn) {
    PNode *amb = 0;
    if (PNode_equal(p, old_pn, r, path, sh)) return old_pn;
    for (amb = old_pn->ambiguities; amb; amb = amb->ambiguities) {
      if (PNode_equal(p, amb, r, path, sh)) return old_pn;
    }
  }
  new_pn = make_PNode(p, hash, symbol, start_loc, e, pn, r, path, sh, scope);
  if (!old_pn) {
    old_pn = new_pn;
    if (!new_pn) return NULL;
    insert_PNode(p, new_pn);
    goto Lreturn;
  }
  if (!new_pn) goto Lreturn;
  p->compares++;
  switch (cmp_pnodes(p, new_pn, old_pn)) {
    case 0:
      ref_pn(new_pn);
      new_pn->ambiguities = old_pn->ambiguities;
      old_pn->ambiguities = new_pn;
      break;
    case -1:
      insert_PNode(p, new_pn);
      LATEST(p, old_pn);
      ref_pn(new_pn);
      old_pn->latest = new_pn;
      old_pn = new_pn;
      break;
    case 1:
      free_PNode(p, new_pn);
      break;
  }
Lreturn:
  return old_pn;
}